

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

_variable_type gl4cts::Utils::getBaseVariableType(_variable_type type)

{
  TestError *this;
  _variable_type local_10;
  _variable_type result;
  _variable_type type_local;
  
  switch(type) {
  case VARIABLE_TYPE_BOOL:
    local_10 = VARIABLE_TYPE_BOOL;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unrecognized variable type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x1a4);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  case VARIABLE_TYPE_DOUBLE:
  case VARIABLE_TYPE_DMAT2:
  case VARIABLE_TYPE_DMAT2X3:
  case VARIABLE_TYPE_DMAT2X4:
  case VARIABLE_TYPE_DMAT3:
  case VARIABLE_TYPE_DMAT3X2:
  case VARIABLE_TYPE_DMAT3X4:
  case VARIABLE_TYPE_DMAT4:
  case VARIABLE_TYPE_DMAT4X2:
  case VARIABLE_TYPE_DMAT4X3:
  case VARIABLE_TYPE_DVEC2:
  case VARIABLE_TYPE_DVEC3:
  case VARIABLE_TYPE_DVEC4:
    local_10 = VARIABLE_TYPE_DOUBLE;
    break;
  case VARIABLE_TYPE_FLOAT:
  case VARIABLE_TYPE_MAT2:
  case VARIABLE_TYPE_MAT2X3:
  case VARIABLE_TYPE_MAT2X4:
  case VARIABLE_TYPE_MAT3:
  case VARIABLE_TYPE_MAT3X2:
  case VARIABLE_TYPE_MAT3X4:
  case VARIABLE_TYPE_MAT4:
  case VARIABLE_TYPE_MAT4X2:
  case VARIABLE_TYPE_MAT4X3:
  case VARIABLE_TYPE_VEC2:
  case VARIABLE_TYPE_VEC3:
  case VARIABLE_TYPE_VEC4:
    local_10 = VARIABLE_TYPE_FLOAT;
    break;
  case VARIABLE_TYPE_INT:
  case VARIABLE_TYPE_IVEC2:
  case VARIABLE_TYPE_IVEC3:
  case VARIABLE_TYPE_IVEC4:
    local_10 = VARIABLE_TYPE_INT;
    break;
  case VARIABLE_TYPE_UINT:
  case VARIABLE_TYPE_UVEC2:
  case VARIABLE_TYPE_UVEC3:
  case VARIABLE_TYPE_UVEC4:
    local_10 = VARIABLE_TYPE_UINT;
  }
  return local_10;
}

Assistant:

Utils::_variable_type Utils::getBaseVariableType(_variable_type type)
{
	_variable_type result = VARIABLE_TYPE_UNKNOWN;

	switch (type)
	{
	case VARIABLE_TYPE_BOOL:
	{
		result = VARIABLE_TYPE_BOOL;

		break;
	}

	case VARIABLE_TYPE_DOUBLE:
	case VARIABLE_TYPE_DMAT2:
	case VARIABLE_TYPE_DMAT2X3:
	case VARIABLE_TYPE_DMAT2X4:
	case VARIABLE_TYPE_DMAT3:
	case VARIABLE_TYPE_DMAT3X2:
	case VARIABLE_TYPE_DMAT3X4:
	case VARIABLE_TYPE_DMAT4:
	case VARIABLE_TYPE_DMAT4X2:
	case VARIABLE_TYPE_DMAT4X3:
	case VARIABLE_TYPE_DVEC2:
	case VARIABLE_TYPE_DVEC3:
	case VARIABLE_TYPE_DVEC4:
	{
		result = VARIABLE_TYPE_DOUBLE;

		break;
	}

	case VARIABLE_TYPE_INT:
	case VARIABLE_TYPE_IVEC2:
	case VARIABLE_TYPE_IVEC3:
	case VARIABLE_TYPE_IVEC4:
	{
		result = VARIABLE_TYPE_INT;

		break;
	}

	case VARIABLE_TYPE_UINT:
	case VARIABLE_TYPE_UVEC2:
	case VARIABLE_TYPE_UVEC3:
	case VARIABLE_TYPE_UVEC4:
	{
		result = VARIABLE_TYPE_UINT;

		break;
	}

	case VARIABLE_TYPE_FLOAT:
	case VARIABLE_TYPE_MAT2:
	case VARIABLE_TYPE_MAT2X3:
	case VARIABLE_TYPE_MAT2X4:
	case VARIABLE_TYPE_MAT3:
	case VARIABLE_TYPE_MAT3X2:
	case VARIABLE_TYPE_MAT3X4:
	case VARIABLE_TYPE_MAT4:
	case VARIABLE_TYPE_MAT4X2:
	case VARIABLE_TYPE_MAT4X3:
	case VARIABLE_TYPE_VEC2:
	case VARIABLE_TYPE_VEC3:
	case VARIABLE_TYPE_VEC4:
	{
		result = VARIABLE_TYPE_FLOAT;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized variable type");
	}
	} /* switch (type) */

	return result;
}